

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

bool __thiscall cfd::core::Psbt::IsFindTxOutRecord(Psbt *this,uint32_t index,ByteData *key)

{
  ByteData local_48;
  bool local_29;
  void *pvStack_28;
  bool is_find;
  wally_psbt *psbt_pointer;
  ByteData *key_local;
  Psbt *pPStack_10;
  uint32_t index_local;
  Psbt *this_local;
  
  psbt_pointer = (wally_psbt *)key;
  key_local._4_4_ = index;
  pPStack_10 = this;
  (*this->_vptr_Psbt[3])(this,(ulong)index,0xc36,"IsFindTxOutRecord");
  pvStack_28 = this->wally_psbt_pointer_;
  local_29 = false;
  GetPsbtOutput(&local_48,(ByteData *)psbt_pointer,
                (wally_psbt_output *)
                (*(long *)((long)pvStack_28 + 0x28) + (ulong)key_local._4_4_ * 0xd0),&local_29);
  ByteData::~ByteData(&local_48);
  return (bool)(local_29 & 1);
}

Assistant:

bool Psbt::IsFindTxOutRecord(uint32_t index, const ByteData &key) const {
  CheckTxOutIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  bool is_find = false;
  GetPsbtOutput(key, &psbt_pointer->outputs[index], &is_find);
  return is_find;
}